

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O0

void Timidity::PrintRIFF(RIFF_Chunk *chunk,int level)

{
  int level_local;
  RIFF_Chunk *chunk_local;
  
  if (level != 0x7f) {
    if (0 < level) {
      PrintRIFF::prefix[(level + -1) * 2] = ' ';
      PrintRIFF::prefix[(level + -1) * 2 + 1] = ' ';
    }
    PrintRIFF::prefix[level << 1] = '\0';
    printf("%sChunk: %c%c%c%c (%d bytes)",PrintRIFF::prefix,(ulong)(chunk->magic & 0xff),
           (ulong)(chunk->magic >> 8 & 0xff),(ulong)(chunk->magic >> 0x10 & 0xff),
           (ulong)(chunk->magic >> 0x18),chunk->length);
    if (chunk->subtype != 0) {
      printf(" subtype: %c%c%c%c",(ulong)(chunk->subtype & 0xff),(ulong)(chunk->subtype >> 8 & 0xff)
             ,(ulong)(chunk->subtype >> 0x10 & 0xff),(ulong)(chunk->subtype >> 0x18));
    }
    printf("\n");
    if (chunk->child != (RIFF_Chunk *)0x0) {
      printf("%s{\n",PrintRIFF::prefix);
      PrintRIFF(chunk->child,level + 1);
      printf("%s}\n",PrintRIFF::prefix);
    }
    if (chunk->next != (RIFF_Chunk *)0x0) {
      PrintRIFF(chunk->next,level);
    }
    if (0 < level) {
      PrintRIFF::prefix[(level + -1) * 2] = '\0';
    }
  }
  return;
}

Assistant:

void PrintRIFF(RIFF_Chunk *chunk, int level)
{
	static char prefix[128];

	if ( level == sizeof(prefix)-1 ) {
		return;
	}
	if ( level > 0 ) {
		prefix[(level-1)*2] = ' ';
		prefix[(level-1)*2+1] = ' ';
	}
	prefix[level*2] = '\0';
	printf("%sChunk: %c%c%c%c (%d bytes)", prefix,
		((chunk->magic >>  0) & 0xFF),
		((chunk->magic >>  8) & 0xFF),
		((chunk->magic >> 16) & 0xFF),
		((chunk->magic >> 24) & 0xFF), chunk->length);
	if ( chunk->subtype ) {
		printf(" subtype: %c%c%c%c",
			((chunk->subtype >>  0) & 0xFF),
			((chunk->subtype >>  8) & 0xFF),
			((chunk->subtype >> 16) & 0xFF),
			((chunk->subtype >> 24) & 0xFF));
	}
	printf("\n");
	if ( chunk->child ) {
		printf("%s{\n", prefix);
		PrintRIFF(chunk->child, level + 1);
		printf("%s}\n", prefix);
	}
	if ( chunk->next ) {
		PrintRIFF(chunk->next, level);
	}
	if ( level > 0 ) {
		prefix[(level-1)*2] = '\0';
	}
}